

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

bool __thiscall
hash_map<int,_Timer::IdState>::is_key_exist(hash_map<int,_Timer::IdState> *this,int *key)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->hm_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  p_Var1 = std::
           _Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)this,(ulong)(long)*key % (this->hm_map)._M_h._M_bucket_count,key,(long)*key
                     );
  if (p_Var1 == (__node_base_ptr)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = p_Var1->_M_nxt != (_Hash_node_base *)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return bVar2;
}

Assistant:

bool is_key_exist(const K& key) {
        unique_lock<mutex> lck(hm_mutex);
        return hm_map.find(key) != hm_map.end();
    }